

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_type(lysp_ctx *ctx,lysp_stmt *stmt,lysp_type *type)

{
  lysp_ext_instance **exts;
  uint8_t *puVar1;
  ly_stmt stmt_00;
  lysp_type *plVar2;
  long lVar3;
  lysp_type *plVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  undefined8 *puVar7;
  lysp_restr *plVar8;
  ushort uVar9;
  ly_ctx *plVar10;
  char *in_R8;
  char *pcVar11;
  lysp_ext_instance **in_R9;
  LY_ERR ret__;
  lysp_stmt *stmt_01;
  bool bVar12;
  char *str_path;
  lyxp_expr **local_70;
  char ***local_68;
  lysp_type_enum **local_60;
  lysp_type_enum **local_58;
  uint8_t *local_50;
  lysp_restr **local_48;
  uint16_t *local_40;
  uint8_t *local_38;
  
  str_path = (char *)0x0;
  if (type->name != (char *)0x0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar10 = (ly_ctx *)0x0;
    }
    else {
      plVar10 = (ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar11 = "type";
LAB_00171dca:
    ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar11);
    return LY_EVALID;
  }
  LVar5 = lysp_stmt_validate_value(ctx,Y_PREF_IDENTIF_ARG,stmt->arg);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar10 = (ly_ctx *)0x0;
  }
  else {
    plVar10 = (ly_ctx *)
              **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar5 = lydict_insert(plVar10,stmt->arg,0,&type->name);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  type->pmod = (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  stmt_01 = stmt->child;
  if (stmt_01 == (lysp_stmt *)0x0) {
    return LY_SUCCESS;
  }
  exts = &type->exts;
  local_38 = &type->require_instance;
  local_40 = &type->flags;
  local_48 = &type->patterns;
  local_70 = &type->path;
  local_50 = &type->fraction_digits;
  local_58 = &type->enums;
  local_60 = &type->bits;
  local_68 = &type->bases;
  LVar5 = LY_SUCCESS;
  do {
    stmt_00 = stmt_01->kw;
    if ((int)stmt_00 < 0x170000) {
      if ((int)stmt_00 < 0xb0000) {
        if (stmt_00 == LY_STMT_BASE) {
          LVar6 = lysp_stmt_text_fields
                            (ctx,stmt_01,local_68,(yang_arg)exts,(lysp_ext_instance **)in_R8);
          uVar9 = 1;
        }
        else {
          if (stmt_00 != LY_STMT_BIT) {
LAB_00172266:
            if (ctx == (lysp_ctx *)0x0) {
              plVar10 = (ly_ctx *)0x0;
            }
            else {
              plVar10 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar11 = lyplg_ext_stmt2str(stmt_00);
            ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar11,"type");
            return LY_EVALID;
          }
          LVar6 = lysp_stmt_type_enum(ctx,stmt_01,local_60);
          uVar9 = 2;
        }
      }
      else if (stmt_00 == LY_STMT_ENUM) {
        LVar6 = lysp_stmt_type_enum(ctx,stmt_01,local_58);
        uVar9 = 4;
      }
      else {
        if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
          in_R8 = (char *)exts;
          LVar6 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_TYPE,0,exts);
          goto LAB_00172036;
        }
        if (stmt_00 != LY_STMT_FRACTION_DIGITS) goto LAB_00172266;
        LVar6 = lysp_stmt_type_fracdigits(ctx,stmt_01,local_50,exts);
        uVar9 = 8;
      }
      goto LAB_00172202;
    }
    if ((int)stmt_00 < 0x260000) {
      if (stmt_00 == LY_STMT_LENGTH) {
        if (type->length != (lysp_restr *)0x0) {
LAB_0017222a:
          if (ctx == (lysp_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar11 = lyplg_ext_stmt2str(stmt_00);
          goto LAB_00171dca;
        }
        plVar8 = (lysp_restr *)calloc(1,0x40);
        type->length = plVar8;
        if (plVar8 == (lysp_restr *)0x0) {
LAB_00172248:
          if (ctx == (lysp_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type");
          return LY_EMEM;
        }
        LVar6 = lysp_stmt_restr(ctx,stmt_01,plVar8);
        uVar9 = 0x10;
LAB_00172202:
        bVar12 = LVar6 == LY_SUCCESS;
        if (!bVar12) {
          LVar5 = LVar6;
        }
      }
      else {
        if (stmt_00 != LY_STMT_PATH) {
          if (stmt_00 != LY_STMT_PATTERN) goto LAB_00172266;
          LVar6 = lysp_stmt_type_pattern(ctx,stmt_01,local_48);
          uVar9 = 0x40;
          goto LAB_00172202;
        }
        LVar6 = lysp_stmt_text_field
                          (ctx,stmt_01,(uint32_t)&str_path,(char **)0x2,(yang_arg)exts,in_R9);
        if (LVar6 != LY_SUCCESS) {
          return LVar6;
        }
        if (ctx == (lysp_ctx *)0x0) {
          plVar10 = (ly_ctx *)0x0;
        }
        else {
          plVar10 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
          ;
        }
        in_R8 = (char *)0x1;
        in_R9 = (lysp_ext_instance **)0x2;
        LVar6 = ly_path_parse(plVar10,(lysc_node *)0x0,str_path,0,'\x01',2,0x10,0x400,local_70);
        plVar10 = (ly_ctx *)0x0;
        if (ctx != (lysp_ctx *)0x0) {
          plVar10 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
          ;
        }
        lydict_remove(plVar10,str_path);
        uVar9 = 0x20;
        bVar12 = LVar6 == LY_SUCCESS;
        if (!bVar12) {
          LVar5 = LVar6;
        }
      }
      if (!bVar12) {
        return LVar5;
      }
      type->flags = type->flags | uVar9;
    }
    else {
      if (stmt_00 == LY_STMT_RANGE) {
        if (type->range != (lysp_restr *)0x0) goto LAB_0017222a;
        plVar8 = (lysp_restr *)calloc(1,0x40);
        type->range = plVar8;
        if (plVar8 == (lysp_restr *)0x0) goto LAB_00172248;
        LVar6 = lysp_stmt_restr(ctx,stmt_01,plVar8);
        uVar9 = 0x80;
        goto LAB_00172202;
      }
      if (stmt_00 != LY_STMT_REQUIRE_INSTANCE) {
        if (stmt_00 != LY_STMT_TYPE) goto LAB_00172266;
        plVar2 = type->types;
        if (plVar2 == (lysp_type *)0x0) {
          puVar7 = (undefined8 *)malloc(0x70);
          if (puVar7 != (undefined8 *)0x0) {
            *puVar7 = 1;
            goto LAB_001720f7;
          }
LAB_00172107:
          if (ctx == (lysp_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          bVar12 = false;
          LVar5 = LY_EMEM;
          in_R8 = "lysp_stmt_type";
          ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
        }
        else {
          lVar3 = *(long *)&plVar2[-1].fraction_digits;
          *(long *)&plVar2[-1].fraction_digits = lVar3 + 1;
          puVar7 = (undefined8 *)realloc(&plVar2[-1].fraction_digits,lVar3 * 0x68 + 0x70);
          if (puVar7 == (undefined8 *)0x0) {
            puVar1 = &type->types[-1].fraction_digits;
            *(long *)puVar1 = *(long *)puVar1 + -1;
            goto LAB_00172107;
          }
LAB_001720f7:
          type->types = (lysp_type *)(puVar7 + 1);
          bVar12 = true;
        }
        if (!bVar12) {
          return LVar5;
        }
        plVar2 = type->types;
        lVar3 = *(long *)&plVar2[-1].fraction_digits;
        plVar2[lVar3 + -1].pmod = (lysp_module *)0x0;
        plVar2[lVar3 + -1].compiled = (lysc_type *)0x0;
        plVar2[lVar3 + -1].types = (lysp_type *)0x0;
        plVar2[lVar3 + -1].exts = (lysp_ext_instance *)0x0;
        plVar2[lVar3 + -1].path = (lyxp_expr *)0x0;
        plVar2[lVar3 + -1].bases = (char **)0x0;
        plVar2[lVar3 + -1].enums = (lysp_type_enum *)0x0;
        plVar2[lVar3 + -1].bits = (lysp_type_enum *)0x0;
        plVar2[lVar3 + -1].length = (lysp_restr *)0x0;
        plVar2[lVar3 + -1].patterns = (lysp_restr *)0x0;
        plVar2[lVar3 + -1].name = (char *)0x0;
        plVar2[lVar3 + -1].range = (lysp_restr *)0x0;
        plVar4 = plVar2 + lVar3 + -1;
        plVar4->fraction_digits = '\0';
        plVar4->require_instance = '\0';
        plVar4->flags = 0;
        *(undefined4 *)&plVar4->field_0x64 = 0;
        LVar6 = lysp_stmt_type(ctx,stmt_01,plVar2 + lVar3 + -1);
        uVar9 = 0x100;
        goto LAB_00172202;
      }
      in_R8 = (char *)exts;
      LVar6 = lysp_stmt_type_reqinstance(ctx,stmt_01,local_38,local_40,exts);
LAB_00172036:
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
    }
    stmt_01 = stmt_01->next;
    if (stmt_01 == (lysp_stmt *)0x0) {
      return LY_SUCCESS;
    }
  } while( true );
}

Assistant:

static LY_ERR
lysp_stmt_type(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_type *type)
{
    struct lysp_type *nest_type;
    const char *str_path = NULL;
    LY_ERR ret;

    if (type->name) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "type");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_PREF_IDENTIF_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &type->name));
    type->pmod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_BASE:
            LY_CHECK_RET(lysp_stmt_text_fields(ctx, child, &type->bases, Y_PREF_IDENTIF_ARG, &type->exts));
            type->flags |= LYS_SET_BASE;
            break;
        case LY_STMT_BIT:
            LY_CHECK_RET(lysp_stmt_type_enum(ctx, child, &type->bits));
            type->flags |= LYS_SET_BIT;
            break;
        case LY_STMT_ENUM:
            LY_CHECK_RET(lysp_stmt_type_enum(ctx, child, &type->enums));
            type->flags |= LYS_SET_ENUM;
            break;
        case LY_STMT_FRACTION_DIGITS:
            LY_CHECK_RET(lysp_stmt_type_fracdigits(ctx, child, &type->fraction_digits, &type->exts));
            type->flags |= LYS_SET_FRDIGITS;
            break;
        case LY_STMT_LENGTH:
            if (type->length) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(child->kw));
                return LY_EVALID;
            }
            type->length = calloc(1, sizeof *type->length);
            LY_CHECK_ERR_RET(!type->length, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(lysp_stmt_restr(ctx, child, type->length));
            type->flags |= LYS_SET_LENGTH;
            break;
        case LY_STMT_PATH:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &str_path, Y_STR_ARG, &type->exts));
            ret = ly_path_parse(PARSER_CTX(ctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                    LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, &type->path);
            lydict_remove(PARSER_CTX(ctx), str_path);
            LY_CHECK_RET(ret);
            type->flags |= LYS_SET_PATH;
            break;
        case LY_STMT_PATTERN:
            LY_CHECK_RET(lysp_stmt_type_pattern(ctx, child, &type->patterns));
            type->flags |= LYS_SET_PATTERN;
            break;
        case LY_STMT_RANGE:
            if (type->range) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(child->kw));
                return LY_EVALID;
            }
            type->range = calloc(1, sizeof *type->range);
            LY_CHECK_ERR_RET(!type->range, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(lysp_stmt_restr(ctx, child, type->range));
            type->flags |= LYS_SET_RANGE;
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            LY_CHECK_RET(lysp_stmt_type_reqinstance(ctx, child, &type->require_instance, &type->flags, &type->exts));
            /* LYS_SET_REQINST checked and set inside lysp_stmt_type_reqinstance() */
            break;
        case LY_STMT_TYPE:
            LY_ARRAY_NEW_RET(PARSER_CTX(ctx), type->types, nest_type, LY_EMEM);
            LY_CHECK_RET(lysp_stmt_type(ctx, child, nest_type));
            type->flags |= LYS_SET_TYPE;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_TYPE, 0, &type->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "type");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}